

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

Var Js::JavascriptOperators::OP_InitCachedScope
              (Var varFunc,PropertyIdArray *propIds,Type *literalType,bool formalsAreLetDecls,
              ScriptContext *scriptContext)

{
  bool bVar1;
  uint extraAttributesSlotCount;
  ThreadContext *pTVar2;
  _func_int **pp_Var3;
  RecyclableObject *value;
  code *pcVar4;
  uint uVar5;
  bool bVar6;
  uint cachedFuncCount;
  uint firstFuncSlot;
  uint index;
  BOOL BVar7;
  JavascriptFunction *pJVar8;
  JavascriptGeneratorFunction *pJVar9;
  FunctionBody *pFVar10;
  DynamicType *pDVar11;
  undefined4 *puVar12;
  RecyclableObject *pRVar13;
  Recycler *this;
  ActivationObjectEx *this_00;
  int iVar14;
  type_info *size;
  Type *addr;
  type_info *ptVar15;
  ActivationObjectEx *this_01;
  uint i;
  ulong uVar16;
  undefined1 local_98 [8];
  TrackAllocData data;
  GeneratorVirtualScriptFunction *local_50;
  uint local_44;
  
  pTVar2 = scriptContext->threadContext;
  bVar1 = pTVar2->noJsReentrancy;
  pTVar2->noJsReentrancy = true;
  bVar6 = VarIs<Js::JavascriptFunction>(varFunc);
  if (bVar6) {
    pJVar8 = VarTo<Js::JavascriptFunction>(varFunc);
    pp_Var3 = (pJVar8->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject;
    if ((((pp_Var3 != (_func_int **)VirtualTableInfo<Js::JavascriptGeneratorFunction>::Address) &&
         (pp_Var3 !=
          (_func_int **)
          VirtualTableInfo<Js::CrossSiteObject<Js::JavascriptGeneratorFunction>_>::Address)) &&
        (pp_Var3 != (_func_int **)VirtualTableInfo<Js::JavascriptAsyncFunction>::Address)) &&
       (pp_Var3 !=
        (_func_int **)VirtualTableInfo<Js::CrossSiteObject<Js::JavascriptAsyncFunction>_>::Address))
    goto LAB_00ab4b4b;
    pJVar9 = VarTo<Js::JavascriptGeneratorFunction>(varFunc);
    local_50 = (pJVar9->scriptFunction).ptr;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1741,"(isGAFunction)","isGAFunction");
    if (!bVar6) goto LAB_00ab4ee1;
    *puVar12 = 0;
LAB_00ab4b4b:
    local_50 = (GeneratorVirtualScriptFunction *)VarTo<Js::ScriptFunction>(varFunc);
  }
  scriptContext->objectLiteralInstanceCount = scriptContext->objectLiteralInstanceCount + 1;
  if (scriptContext->objectLiteralMaxLength < propIds->count) {
    scriptContext->objectLiteralMaxLength = propIds->count;
  }
  cachedFuncCount = ActivationObjectEx::GetCachedFuncCount(propIds);
  firstFuncSlot = ActivationObjectEx::GetFirstFuncSlot(propIds);
  index = ActivationObjectEx::GetFirstVarSlot(propIds);
  if (firstFuncSlot == 0xffffffff) {
    local_44 = 0xffffffff;
  }
  else {
    uVar5 = index;
    if (index == 0xffffffff || (int)index < (int)firstFuncSlot) {
      uVar5 = propIds->count;
    }
    local_44 = uVar5 - 1;
  }
  pDVar11 = literalType->ptr;
  if (pDVar11 == (DynamicType *)0x0) {
    pDVar11 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->activationObjectType).
              ptr;
    if (formalsAreLetDecls) {
      extraAttributesSlotCount = firstFuncSlot;
      if ((firstFuncSlot == 0xffffffff) && (extraAttributesSlotCount = index, index == 0xffffffff))
      {
        extraAttributesSlotCount = propIds->count;
      }
      pFVar10 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)local_50);
      if ((pFVar10->field_0x17b & 2) == 0) {
        pDVar11 = PathTypeHandlerBase::CreateNewScopeObject<false>
                            (scriptContext,pDVar11,propIds,'@',extraAttributesSlotCount);
      }
      else {
        pDVar11 = PathTypeHandlerBase::CreateNewScopeObject<true>
                            (scriptContext,pDVar11,propIds,'@',extraAttributesSlotCount);
      }
    }
    else {
      pDVar11 = PathTypeHandlerBase::CreateNewScopeObject<false>
                          (scriptContext,pDVar11,propIds,'\0',0xffffffff);
    }
    Memory::Recycler::WBSetBit((char *)literalType);
    literalType->ptr = pDVar11;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(literalType);
  }
  else {
    scriptContext->objectLiteralCacheCount = scriptContext->objectLiteralCacheCount + 1;
  }
  value = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase
          ).undefinedValue.ptr;
  this_01 = (local_50->super_ScriptFunction).cachedScopeObj.ptr;
  if ((this_01 == (ActivationObjectEx *)0x0) || (this_01->committed != true)) {
    iVar14 = cachedFuncCount - 1;
    if (cachedFuncCount == 0) {
      iVar14 = 0;
    }
    ptVar15 = (type_info *)((long)iVar14 * 0x10);
    local_98 = (undefined1  [8])&ActivationObjectEx::typeinfo;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_4e91f59;
    data.filename._0_4_ = 0x1794;
    data.typeinfo = ptVar15;
    this = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_98);
    BVar7 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar7 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      data._32_8_ = __tls_get_addr(&PTR_01548f08);
      *(undefined4 *)data._32_8_ = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar6) goto LAB_00ab4ee1;
      *(undefined4 *)data._32_8_ = 0;
    }
    size = (type_info *)&DAT_ffffffffffffffff;
    if (ptVar15 < (type_info *)0xffffffffffffffb8) {
      size = ptVar15 + 0x48;
    }
    this_00 = (ActivationObjectEx *)
              Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                        (this,(size_t)size);
    if (this_00 == (ActivationObjectEx *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x20d,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar6) {
LAB_00ab4ee1:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar12 = 0;
    }
    ActivationObjectEx::ActivationObjectEx
              (this_00,pDVar11,&local_50->super_ScriptFunction,cachedFuncCount,firstFuncSlot,
               local_44);
    if (this_01 == (ActivationObjectEx *)0x0) {
      addr = &(local_50->super_ScriptFunction).cachedScopeObj;
      Memory::Recycler::WBSetBit((char *)addr);
      addr->ptr = this_00;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    }
    this_01 = this_00;
    if (index < propIds->count) {
      uVar16 = (ulong)index;
      do {
        DynamicObject::SetSlot
                  ((DynamicObject *)this_00,(&propIds[1].count)[uVar16],false,(int)uVar16,value);
        uVar16 = uVar16 + 1;
      } while (uVar16 < propIds->count);
    }
  }
  else {
    DynamicObject::ReplaceType((DynamicObject *)this_01,pDVar11);
    this_01->committed = false;
    if (index < propIds->count) {
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      do {
        pRVar13 = (RecyclableObject *)DynamicObject::GetSlot((DynamicObject *)this_01,index);
        if (pRVar13 != value) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar12 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x178e,"(scopeObjEx->GetSlot(i) == undef)",
                                      "Var attached to cached scope");
          if (!bVar6) goto LAB_00ab4ee1;
          *puVar12 = 0;
        }
        index = index + 1;
      } while (index < propIds->count);
    }
  }
  pTVar2->noJsReentrancy = bVar1;
  return this_01;
}

Assistant:

Var JavascriptOperators::OP_InitCachedScope(Var varFunc, const Js::PropertyIdArray *propIds, Field(DynamicType*)* literalType, bool formalsAreLetDecls, ScriptContext *scriptContext)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(OP_InitCachedScope, reentrancylock, scriptContext->GetThreadContext());
        bool isGAFunction = VarIs<JavascriptFunction>(varFunc);
        Assert(isGAFunction);
        if (isGAFunction)
        {
            JavascriptFunction *function = VarTo<JavascriptFunction>(varFunc);
            isGAFunction = JavascriptGeneratorFunction::Test(function) || JavascriptAsyncFunction::Test(function);
        }

        ScriptFunction *func = isGAFunction ?
            VarTo<JavascriptGeneratorFunction>(varFunc)->GetGeneratorVirtualScriptFunction() :
            VarTo<ScriptFunction>(varFunc);

#ifdef PROFILE_OBJECT_LITERALS
        // Empty objects not counted in the object literal counts
        scriptContext->objectLiteralInstanceCount++;
        if (propIds->count > scriptContext->objectLiteralMaxLength)
        {
            scriptContext->objectLiteralMaxLength = propIds->count;
        }
#endif

        PropertyId cachedFuncCount = ActivationObjectEx::GetCachedFuncCount(propIds);
        PropertyId firstFuncSlot = ActivationObjectEx::GetFirstFuncSlot(propIds);
        PropertyId firstVarSlot = ActivationObjectEx::GetFirstVarSlot(propIds);
        PropertyId lastFuncSlot = Constants::NoProperty;

        if (firstFuncSlot != Constants::NoProperty)
        {
            if (firstVarSlot == Constants::NoProperty || firstVarSlot < firstFuncSlot)
            {
                lastFuncSlot = propIds->count - 1;
            }
            else
            {
                lastFuncSlot = firstVarSlot - 1;
            }
        }

        DynamicType *type = *literalType;
        if (type != nullptr)
        {
#ifdef PROFILE_OBJECT_LITERALS
            scriptContext->objectLiteralCacheCount++;
#endif
        }
        else
        {
            type = scriptContext->GetLibrary()->GetActivationObjectType();
            if (formalsAreLetDecls)
            {
                uint formalsSlotLimit = (firstFuncSlot != Constants::NoProperty) ? (uint)firstFuncSlot :
                                        (firstVarSlot != Constants::NoProperty) ? (uint)firstVarSlot :
                                        propIds->count;
                if (func->GetFunctionBody()->HasReferenceableBuiltInArguments())
                {
                    type = PathTypeHandlerBase::CreateNewScopeObject<true>(scriptContext, type, propIds, PropertyLet, formalsSlotLimit);
                }
                else
                {
                    type = PathTypeHandlerBase::CreateNewScopeObject<false>(scriptContext, type, propIds, PropertyLet, formalsSlotLimit);
                }
            }
            else
            {
                type = PathTypeHandlerBase::CreateNewScopeObject<false>(scriptContext, type, propIds);
            }
            *literalType = type;
        }
        Var undef = scriptContext->GetLibrary()->GetUndefined();

        ActivationObjectEx *scopeObjEx = func->GetCachedScope();
        if (scopeObjEx && scopeObjEx->IsCommitted())
        {
            scopeObjEx->ReplaceType(type);
            scopeObjEx->SetCommit(false);
#if DBG
            for (uint i = firstVarSlot; i < propIds->count; i++)
            {
                AssertMsg(scopeObjEx->GetSlot(i) == undef, "Var attached to cached scope");
            }
#endif
        }
        else
        {
            ActivationObjectEx *tmp = RecyclerNewPlus(scriptContext->GetRecycler(), (cachedFuncCount == 0 ? 0 : cachedFuncCount - 1) * sizeof(FuncCacheEntry), ActivationObjectEx, type, func, cachedFuncCount, firstFuncSlot, lastFuncSlot);
            if (!scopeObjEx)
            {
                func->SetCachedScope(tmp);
            }
            scopeObjEx = tmp;

            for (uint i = firstVarSlot; i < propIds->count; i++)
            {
                scopeObjEx->SetSlot(SetSlotArguments(propIds->elements[i], i, undef));
            }
        }

        return scopeObjEx;
        JIT_HELPER_END(OP_InitCachedScope);
    }